

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool __thiscall pugi::xml_node::set_name(xml_node *this,char_t *rhs)

{
  xml_node_type xVar1;
  char_t *rhs_local;
  xml_node *this_local;
  
  xVar1 = type(this);
  if ((xVar1 == node_element) || (xVar1 == node_pi || xVar1 == node_declaration)) {
    this_local._7_1_ =
         impl::anon_unknown_0::strcpy_insitu(&this->_root->name,&this->_root->header,0x10,rhs);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

PUGI__FN bool xml_node::set_name(const char_t* rhs)
	{
		switch (type())
		{
		case node_pi:
		case node_declaration:
		case node_element:
			return impl::strcpy_insitu(_root->name, _root->header, impl::xml_memory_page_name_allocated_mask, rhs);

		default:
			return false;
		}
	}